

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# toucs.c
# Opt level: O3

wchar_t charset_to_unicode(char **input,wchar_t *inlen,wchar_t *output,wchar_t outlen,
                          wchar_t charset,charset_state *state,wchar_t *errstr,wchar_t errlen)

{
  wchar_t wVar1;
  charset_spec *pcVar2;
  char *pcVar3;
  wchar_t *pwVar4;
  unicode_emit_param param;
  charset_state local_58;
  wchar_t *local_50;
  wchar_t local_48;
  wchar_t *local_40;
  wchar_t local_38;
  int local_34;
  
  pcVar2 = charset_find_spec(charset);
  local_40 = errstr;
  local_38 = errlen;
  local_34 = 0;
  if (state == (charset_state *)0x0) {
    local_58.s0 = 0;
  }
  else {
    local_58 = (charset_state)state->s0;
  }
  pwVar4 = output;
  if (L'\0' < *inlen) {
    pcVar3 = *input;
    local_50 = output;
    local_48 = outlen;
    do {
      pwVar4 = local_50;
      (*pcVar2->read)(pcVar2,(long)*pcVar3,&local_58,unicode_emit,&local_50);
      if (local_34 != 0) break;
      if (state != (charset_state *)0x0) {
        state->s0 = (unsigned_long)local_58;
      }
      pcVar3 = *input + 1;
      *input = pcVar3;
      wVar1 = *inlen;
      *inlen = wVar1 + L'\xffffffff';
      pwVar4 = local_50;
    } while (L'\x01' < wVar1);
  }
  return (wchar_t)((ulong)((long)pwVar4 - (long)output) >> 2);
}

Assistant:

int charset_to_unicode(const char **input, int *inlen,
                       wchar_t *output, int outlen,
                       int charset, charset_state *state,
                       const wchar_t *errstr, int errlen)
{
    charset_spec const *spec = charset_find_spec(charset);
    charset_state localstate;
    struct unicode_emit_param param;

    param.output = output;
    param.outlen = outlen;
    param.errstr = errstr;
    param.errlen = errlen;
    param.stopped = 0;

    if (!state) {
        localstate.s0 = 0;
    } else {
        localstate = *state;           /* structure copy */
    }

    while (*inlen > 0) {
        int lenbefore = param.output - output;
        spec->read(spec, (unsigned char)**input, &localstate,
                   unicode_emit, &param);
        if (param.stopped) {
            /*
             * The emit function has _tried_ to output some
             * characters, but ran up against the end of the
             * buffer. Leave immediately, and return what happened
             * _before_ attempting to process this character.
             */
            return lenbefore;
        }
        if (state)
            *state = localstate;   /* structure copy */
        (*input)++;
        (*inlen)--;
    }

    return param.output - output;
}